

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O1

void getLibraryPath(void *symbol,char **path,uint *pathLength)

{
  uchar uVar1;
  size_t sVar2;
  Dl_info dlInfo;
  char *local_40 [4];
  
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    if (symbol == (void *)0x0) {
      invalidateStringOutParameter(path,pathLength);
      return;
    }
    dladdr(symbol,local_40);
    if (local_40[0] == (char *)0x0) {
      invalidateStringOutParameter(path,pathLength);
    }
    else {
      sVar2 = strlen(local_40[0]);
      copyToStringOutParameter(local_40[0],(uint)sVar2,path,pathLength);
    }
  }
  return;
}

Assistant:

void getLibraryPath(void * symbol, char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    if (!symbol)
    {
        invalidateStringOutParameter(path, pathLength);
        return;
    }

#if defined SYSTEM_WINDOWS

    char systemPath[MAX_PATH];
    systemPath[0] = '\0';

    HMODULE module;

    if (GetModuleHandleExA(
            GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS | GET_MODULE_HANDLE_EX_FLAG_UNCHANGED_REFCOUNT,
            (LPCSTR)symbol,
            &module))
    {
        GetModuleFileNameA(module, systemPath, MAX_PATH);
    }

    unsigned int len = (unsigned int)strnlen(systemPath, MAX_PATH);

    copyToStringOutParameter(systemPath, len, path, pathLength);

#else

    Dl_info dlInfo;
    dladdr(symbol, &dlInfo);

    if (!dlInfo.dli_fname)
    {
        invalidateStringOutParameter(path, pathLength);
        return;
    }

    unsigned int len = strlen(dlInfo.dli_fname);
    copyToStringOutParameter(dlInfo.dli_fname, len, path, pathLength);

#endif

    // Return path with system path delimiters
    // unifyPathDelimiters(*path, *pathLength);
}